

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_delete.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::DuckCatalog::PlanDelete
          (DuckCatalog *this,ClientContext *context,PhysicalPlanGenerator *planner,LogicalDelete *op
          ,PhysicalOperator *plan)

{
  TableCatalogEntry *args_1;
  int iVar1;
  reference this_00;
  pointer this_01;
  BoundReferenceExpression *pBVar2;
  undefined4 extraout_var;
  PhysicalOperator *pPVar3;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&(op->super_LogicalOperator).expressions,0);
  this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  pBVar2 = BaseExpression::Cast<duckdb::BoundReferenceExpression>(&this_01->super_BaseExpression);
  args_1 = op->table;
  iVar1 = (*(args_1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(args_1);
  pPVar3 = PhysicalPlanGenerator::
           Make<duckdb::PhysicalDelete,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableCatalogEntry&,duckdb::DataTable&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>,unsigned_long&,unsigned_long&,bool&>
                     (planner,&(op->super_LogicalOperator).types,args_1,
                      (DataTable *)CONCAT44(extraout_var,iVar1),&op->bound_constraints,
                      &pBVar2->index,&(op->super_LogicalOperator).estimated_cardinality,
                      &op->return_chunk);
  local_38._M_data = plan;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&pPVar3->children,&local_38);
  return pPVar3;
}

Assistant:

PhysicalOperator &DuckCatalog::PlanDelete(ClientContext &context, PhysicalPlanGenerator &planner, LogicalDelete &op,
                                          PhysicalOperator &plan) {
	// Get the row_id column index.
	auto &bound_ref = op.expressions[0]->Cast<BoundReferenceExpression>();
	auto &del = planner.Make<PhysicalDelete>(op.types, op.table, op.table.GetStorage(), std::move(op.bound_constraints),
	                                         bound_ref.index, op.estimated_cardinality, op.return_chunk);
	del.children.push_back(plan);
	return del;
}